

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

FinalizableObject * __thiscall
TTD::ThreadContextTTD::GetRuntimeContextForScriptContext(ThreadContextTTD *this,ScriptContext *ctx)

{
  FinalizableObject **ppFVar1;
  FinalizableObject *local_20;
  ScriptContext *local_18;
  ScriptContext *ctx_local;
  ThreadContextTTD *this_local;
  
  local_20 = (FinalizableObject *)0x0;
  local_18 = ctx;
  ctx_local = (ScriptContext *)this;
  ppFVar1 = JsUtil::
            BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Lookup(&this->m_ttdContextToExternalRefMap,&local_18,&local_20);
  return *ppFVar1;
}

Assistant:

FinalizableObject* ThreadContextTTD::GetRuntimeContextForScriptContext(Js::ScriptContext* ctx)
    {
        return this->m_ttdContextToExternalRefMap.Lookup(ctx, nullptr);
    }